

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_transport_pc.c
# Opt level: O0

int ll_tty_open(char *dev_name,int baudrate)

{
  undefined1 local_58 [8];
  termios tc;
  int baudrate_local;
  char *dev_name_local;
  
  tc.c_ispeed = baudrate;
  unique0x1000016e = dev_name;
  if (-1 < g_tty_fd) {
    printf("ll_tty_open: already open.");
    ll_tty_close();
  }
  if (tc.c_ispeed == 0) {
    tc.c_ispeed = 0x1c200;
  }
  else if (tc.c_ispeed != 0x1c200) {
    return -1;
  }
  if (stack0xffffffffffffffe8 == (char *)0x0) {
    stack0xffffffffffffffe8 = "/dev/ttyUSB0";
  }
  g_tty_fd = open(stack0xffffffffffffffe8,0x101902);
  if (g_tty_fd < 0) {
    perror("ll_tty_open");
    dev_name_local._4_4_ = -1;
  }
  else {
    printf("Open %s baud %d\n",stack0xffffffffffffffe8,(ulong)tc.c_ispeed);
    tcgetattr(g_tty_fd,(termios *)local_58);
    local_58._0_4_ = local_58._0_4_ & 0xffffea02;
    local_58._4_4_ = local_58._4_4_ & 0xffffffb2;
    tc.c_iflag = tc.c_iflag & 0x7ffffe8f | 0xcb0;
    tc.c_oflag = tc.c_oflag & 0xffff7f34;
    memset((void *)((long)&tc.c_cflag + 1),0,0x20);
    cfsetspeed((termios *)local_58,0x1002);
    tcsetattr(g_tty_fd,2,(termios *)local_58);
    tcflow(g_tty_fd,3);
    ll_tty_flush();
    dev_name_local._4_4_ = 0;
  }
  return dev_name_local._4_4_;
}

Assistant:

int ll_tty_open(const char *dev_name, int baudrate)
{
    if (g_tty_fd >= 0)
    {
        printf("ll_tty_open: already open.");
		ll_tty_close();
    }
	if (baudrate == 0) 
	{
		baudrate = LL_TTY_DEFAULT_BAUDRATE;
    }
    else if (baudrate != LL_TTY_DEFAULT_BAUDRATE)
    {
        return(-1);
    }
    if (dev_name == NULL)
    {
        dev_name = LL_TTY_DEFAULT_DEVICE;
    }

    g_tty_fd = open(dev_name, O_RDWR | O_NOCTTY | O_SYNC | O_NDELAY);
    if(g_tty_fd < 0)
    {
        perror("ll_tty_open");
        return(-1);
    }
    printf("Open %s baud %d\n", dev_name, baudrate);

    /* Turn off blocking for reads, use (g_tty_fd, F_SETFL, FNDELAY) if you want that */
    struct termios tc;
    tcgetattr(g_tty_fd, &tc);

    /* input flags */
    tc.c_iflag &= ~ IGNBRK; /* enable ignoring break */
    tc.c_iflag &= ~(IGNPAR | PARMRK); /* disable parity checks */
    tc.c_iflag &= ~ INPCK; /* disable parity checking */
    tc.c_iflag &= ~ ISTRIP; /* disable stripping 8th bit */
    tc.c_iflag &= ~(INLCR | ICRNL); /* disable translating NL <-> CR */
    tc.c_iflag &= ~ IGNCR; /* disable ignoring CR */
    tc.c_iflag &= ~(IXON | IXOFF); /* disable XON/XOFF flow control */
    /* output flags */
    tc.c_oflag &= ~ OPOST; /* disable output processing */
    tc.c_oflag &= ~(ONLCR | OCRNL); /* disable translating NL <-> CR */
    /* not for FreeBSD */
    tc.c_oflag &= ~ OFILL; /* disable fill characters */
    /* control flags */
    tc.c_cflag |= CLOCAL; /* prevent changing ownership */
    tc.c_cflag |= CREAD; /* enable reciever */
    tc.c_cflag &= ~ PARENB; /* disable parity */
    tc.c_cflag &= ~ CSTOPB; /* disable 2 stop bits */
    tc.c_cflag &= ~ CSIZE; /* remove size flag... */
    tc.c_cflag |= CS8; /* ...enable 8 bit characters */
    tc.c_cflag |= HUPCL; /* enable lower control lines on close - hang up */
    tc.c_cflag &= ~ CRTSCTS; /* disable hardware CTS/RTS flow control */
    /* local flags */
    tc.c_lflag &= ~ ISIG; /* disable generating signals */
    tc.c_lflag &= ~ ICANON; /* disable canonical mode - line by line */
    tc.c_lflag &= ~ ECHO; /* disable echoing characters */
    tc.c_lflag &= ~ ECHONL; /* ??? */
    tc.c_lflag &= ~ NOFLSH; /* disable flushing on SIGINT */
    tc.c_lflag &= ~ IEXTEN; /* disable input processing */

    /* control characters */
    memset(tc.c_cc,0,sizeof(tc.c_cc));

    /* set i/o baud rate */
    cfsetspeed(&tc, B115200);
    tcsetattr(g_tty_fd, TCSAFLUSH, &tc);

    /* enable input & output transmission */
    tcflow(g_tty_fd, TCOON | TCION);

	ll_tty_flush();
    return(0);
}